

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> * __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,bool,bool,bool>
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>
           *this,NoThrowHeapAllocator *allocator,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *param1,bool param2,bool param3,bool param4)

{
  long lVar1;
  NoThrowHeapAllocator *alloc;
  long *plVar2;
  undefined3 in_register_00000089;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._37_3_ = in_register_00000089;
  data._36_1_ = param4;
  local_68 = (undefined1  [8])
             &DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26dcec;
  data.filename._0_4_ = 0x13e;
  alloc = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_68);
  plVar2 = (long *)new<Memory::NoThrowHeapAllocator>(0x98,alloc,0x61b984);
  Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::PageSegmentBase
            ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)(plVar2 + 2),param1,param2,
             param3,data._36_1_);
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3, TParam4 param4)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3, param4);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }